

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stcp.c
# Opt level: O0

int nn_stcp_recv(nn_pipebase *self,nn_msg *msg)

{
  nn_msg *dst;
  size_t in_RSI;
  void *in_RDI;
  nn_usock *unaff_retaddr;
  nn_stcp *stcp;
  nn_msg *in_stack_ffffffffffffffd8;
  nn_msg *fd;
  
  if (in_RDI == (void *)0x0) {
    dst = (nn_msg *)0x0;
  }
  else {
    dst = (nn_msg *)((long)in_RDI + -0x210);
  }
  if (*(int *)((long)&(dst->body).u + 0x18) != 4) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",
            (ulong)*(uint *)((long)&(dst->body).u + 0x18),"NN_STCP_STATE_ACTIVE",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/tcp/stcp.c"
            ,0x9f);
    fflush(_stderr);
    nn_err_abort();
  }
  if (*(int *)((long)&dst[7].body.u + 8) != 3) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","stcp->instate == NN_STCP_INSTATE_HASMSG",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/tcp/stcp.c"
            ,0xa0);
    fflush(_stderr);
    nn_err_abort();
  }
  fd = dst;
  nn_msg_mv(dst,in_stack_ffffffffffffffd8);
  nn_msg_init(dst,(size_t)in_stack_ffffffffffffffd8);
  *(undefined4 *)((long)&fd[7].body.u + 8) = 1;
  nn_usock_recv(unaff_retaddr,in_RDI,in_RSI,(int *)fd);
  return 0;
}

Assistant:

static int nn_stcp_recv (struct nn_pipebase *self, struct nn_msg *msg)
{
    struct nn_stcp *stcp;

    stcp = nn_cont (self, struct nn_stcp, pipebase);

    nn_assert_state (stcp, NN_STCP_STATE_ACTIVE);
    nn_assert (stcp->instate == NN_STCP_INSTATE_HASMSG);

    /*  Move received message to the user. */
    nn_msg_mv (msg, &stcp->inmsg);
    nn_msg_init (&stcp->inmsg, 0);

    /*  Start receiving new message. */
    stcp->instate = NN_STCP_INSTATE_HDR;
    nn_usock_recv (stcp->usock, stcp->inhdr, sizeof (stcp->inhdr), NULL);

    return 0;
}